

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O0

void __thiscall hwtest::pgraph::anon_unknown_15::MthdClipSize::~MthdClipSize(MthdClipSize *this)

{
  MthdClipSize *this_local;
  
  ~MthdClipSize(this);
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		int vidx = chipset.card_type < 0x10 ? 13 : 9;
		exp.vtx_xy[vidx][0] = extr(val, 0, 16);
		exp.vtx_xy[vidx][1] = extr(val, 16, 16);
		int xcstat = nv04_pgraph_clip_status(&exp, exp.vtx_xy[vidx][0], 0);
		int ycstat = nv04_pgraph_clip_status(&exp, exp.vtx_xy[vidx][1], 1);
		pgraph_set_xy_d(&exp, 0, 1, 1, false, false, false, xcstat);
		pgraph_set_xy_d(&exp, 1, 1, 1, false, false, false, ycstat);
		exp.uclip_min[0][0] = 0;
		exp.uclip_min[0][1] = 0;
		exp.uclip_max[0][0] = exp.vtx_xy[vidx][0];
		exp.uclip_max[0][1] = exp.vtx_xy[vidx][1];
		insrt(exp.valid[0], 28, 1, 0);
		insrt(exp.valid[0], 30, 1, 0);
		insrt(exp.xy_misc_1[0], 4, 2, 0);
		insrt(exp.xy_misc_1[0], 12, 1, 0);
		insrt(exp.xy_misc_1[0], 16, 1, 0);
		insrt(exp.xy_misc_1[0], 20, 1, 0);
	}